

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Limb::Initialize
          (RS_Limb *this,shared_ptr<chrono::ChBodyAuxRef> *chassis,ChVector<double> *xyz,
          ChVector<double> *rpy,Enum collision_family,ActuationMode wheel_mode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long *plVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  iterator iVar5;
  ChFrame<double> *pCVar6;
  long lVar7;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  shared_ptr<chrono::ChLinkMotorRotationAngle> joint_1;
  shared_ptr<chrono::ChLinkLockLock> joint;
  shared_ptr<chrono::ChBodyAuxRef> child_body;
  shared_ptr<chrono::ChBodyAuxRef> parent_body;
  shared_ptr<chrono::robosimian::RS_Part> child;
  shared_ptr<chrono::robosimian::RS_Part> parent;
  ChFrame<double> X_GC;
  ChFrame<double> X_GP;
  ChFrame<double> X_PC;
  __shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2> local_598;
  long local_588;
  __shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2> local_580;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_570;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *local_560;
  RS_Limb *local_558;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_550;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_540;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_538;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_530;
  ActuationMode local_524;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  __shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2> *local_500;
  __shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2> local_4f8;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_4e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_4d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_4c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4c0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_4b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_4a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_498 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_490;
  __shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2> local_488;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_478 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_468 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_458 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_448 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_438 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_430;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_428 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_420;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_418 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_408 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  ChFrame<double> local_3f8;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_370 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  ChFrame<double> local_360;
  ChFrame<double> local_2d8;
  ChFrame<double> local_250;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  local_560 = &chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>;
  local_524 = wheel_mode;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_550,
             &chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_2d8,"link0",(allocator *)&local_250);
  this_00 = &(this->m_links)._M_h;
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(this_00,(key_type *)&local_2d8);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_570,
             (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                              ._M_cur + 0x28) + 0x28));
  std::__cxx11::string::~string((string *)&local_2d8);
  pCVar6 = (ChFrame<double> *)(**(code **)(*(long *)local_550._M_ptr + 0x1f0))();
  ChFrame<double>::ChFrame(&local_2d8,pCVar6);
  rpy2quat((ChQuaternion<double> *)&local_360,rpy);
  ChFrame<double>::ChFrame(&local_250,xyz,(ChQuaternion<double> *)&local_360);
  ChFrame<double>::operator*(&local_360,&local_2d8,&local_250);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs((ChFrame *)local_570._M_ptr);
  local_538 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&this->m_joints;
  local_530 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&this->m_motors;
  local_500 = (__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2> *)
              &this->m_wheel_motor;
  lVar7 = 0;
  local_558 = this;
  local_540 = this_00;
  while (lVar7 != 0x6e0) {
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_00,(key_type *)(joints + lVar7 + 0x20));
    std::__shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_488,
               (__shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                      ._M_cur + 0x28));
    local_588 = lVar7;
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_00,(key_type *)(joints + lVar7 + 0x40));
    std::__shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_4f8,
               (__shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                      ._M_cur + 0x28));
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_550,
               &((local_488._M_ptr)->m_body).
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_570,
               &((local_4f8._M_ptr)->m_body).
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    pCVar6 = (ChFrame<double> *)(**(code **)(*(long *)local_550._M_ptr + 0x1f0))();
    ChFrame<double>::operator=(&local_2d8,pCVar6);
    lVar7 = local_588;
    rpy2quat((ChQuaternion<double> *)&local_520,(ChVector<double> *)(joints + local_588 + 0x80));
    ChFrame<double>::ChFrame
              (&local_3f8,(ChVector<double> *)(joints + lVar7 + 0x68),
               (ChQuaternion<double> *)&local_520);
    ChFrame<double>::operator=(&local_250,&local_3f8);
    ChFrame<double>::operator*(&local_3f8,&local_2d8,&local_250);
    ChFrame<double>::operator=(&local_360,&local_3f8);
    chrono::ChBodyAuxRef::SetFrame_REF_to_abs((ChFrame *)local_570._M_ptr);
    if (local_588 == 0) {
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_550,local_560);
    }
    RS_Part::AddCollisionShapes(local_4f8._M_ptr);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_3f8,
               (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               (local_570._M_ptr + 0x198));
    (**(code **)(*local_3f8._vptr_ChFrame + 200))(local_3f8._vptr_ChFrame,collision_family);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3f8.coord);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_3f8,
               (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               (local_570._M_ptr + 0x198));
    (**(code **)(*local_3f8._vptr_ChFrame + 0xd8))(local_3f8._vptr_ChFrame,collision_family);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3f8.coord);
    chrono::ChBody::SetCollide(SUB81(local_570._M_ptr,0));
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (joints + local_588);
    if (joints[local_588 + 0x60] == '\x01') {
      chrono_types::make_shared<chrono::ChLinkLockLock,_0>();
      peVar3 = local_580._M_ptr;
      std::operator+(&local_520,&local_558->m_name,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3f8
                     ,&local_520,__rhs);
      std::__cxx11::string::_M_assign((string *)(peVar3 + 8));
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_520);
      peVar3 = local_580._M_ptr;
      std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBodyAuxRef,void>(local_408,&local_550);
      std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBodyAuxRef,void>(local_418,&local_570);
      calcJointFrame((ChCoordsys<double> *)&local_3f8,&local_360,
                     (ChVector<double> *)(joints + local_588 + 0x98));
      (**(code **)(*(long *)peVar3 + 0x250))(peVar3,local_408,local_418,&local_3f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_400);
      plVar1 = *(long **)(((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                          &local_560->_M_ptr)->_M_ptr + 0x38);
      std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChLinkLockLock,void>(local_428,&local_580);
      (**(code **)(*plVar1 + 0x138))(plVar1,local_428);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
      ::pair<std::shared_ptr<chrono::ChLinkLockLock>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
                  *)&local_3f8,__rhs,(shared_ptr<chrono::ChLinkLockLock> *)&local_580);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkLockLock>>>
                (local_538,&local_3f8);
      this_00 = local_540;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
               *)&local_3f8);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar4 == 0) {
        if (local_524 == SPEED) {
          std::make_shared<chrono::ChFunction_Setpoint>();
          std::make_shared<chrono::ChLinkMotorRotationSpeed>();
          peVar2 = local_598._M_ptr;
          std::operator+(&local_520,&local_558->m_name,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_3f8,&local_520,__rhs);
          std::__cxx11::string::_M_assign((string *)(peVar2 + 8));
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_520);
          peVar2 = local_598._M_ptr;
          std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChBodyAuxRef,void>(local_4b8,&local_550);
          std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChBodyAuxRef,void>(local_4c8,&local_570);
          calcJointFrame((ChCoordsys<double> *)&local_3f8,&local_360,
                         (ChVector<double> *)(joints + local_588 + 0x98));
          ChFrame<double>::ChFrame(&local_140,(ChCoordsys<double> *)&local_3f8);
          (**(code **)(*(long *)peVar2 + 0x240))(peVar2,local_4b8,local_4c8,&local_140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4c0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4b0);
          peVar2 = local_598._M_ptr;
          std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChFunction_Setpoint,void>
                    (local_370,
                     (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_580);
          ChLinkMotorRotationSpeed::SetSpeedFunction
                    ((ChLinkMotorRotationSpeed *)peVar2,(shared_ptr<chrono::ChFunction> *)local_370)
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368);
          plVar1 = *(long **)(((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                              &local_560->_M_ptr)->_M_ptr + 0x38);
          std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChLinkMotorRotationSpeed,void>
                    (local_458,
                     (__shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_598);
          (**(code **)(*plVar1 + 0x138))(plVar1,local_458);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_450);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::pair<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
                      *)&local_3f8,__rhs,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)&local_598)
          ;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
                    (local_538,&local_3f8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
                   *)&local_3f8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::pair<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
                      *)&local_3f8,__rhs,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)&local_598)
          ;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
                    (local_530,&local_3f8);
          this_00 = local_540;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
                   *)&local_3f8);
          std::__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_500,
                     (__shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_598);
        }
        else {
          std::make_shared<chrono::ChFunction_Setpoint>();
          std::make_shared<chrono::ChLinkMotorRotationAngle>();
          peVar2 = local_598._M_ptr;
          std::operator+(&local_520,&local_558->m_name,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_3f8,&local_520,__rhs);
          std::__cxx11::string::_M_assign((string *)(peVar2 + 8));
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_520);
          peVar2 = local_598._M_ptr;
          std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChBodyAuxRef,void>(local_4d8,&local_550);
          std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChBodyAuxRef,void>(local_4e8,&local_570);
          calcJointFrame((ChCoordsys<double> *)&local_3f8,&local_360,
                         (ChVector<double> *)(joints + local_588 + 0x98));
          ChFrame<double>::ChFrame(&local_1c8,(ChCoordsys<double> *)&local_3f8);
          (**(code **)(*(long *)peVar2 + 0x240))(peVar2,local_4d8,local_4e8,&local_1c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d0);
          peVar2 = local_598._M_ptr;
          std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChFunction_Setpoint,void>
                    (local_468,
                     (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_580);
          ChLinkMotorRotationAngle::SetAngleFunction
                    (peVar2,(shared_ptr<chrono::ChFunction> *)local_468);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_460);
          plVar1 = *(long **)(((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                              &local_560->_M_ptr)->_M_ptr + 0x38);
          std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChLinkMotorRotationAngle,void>(local_478,&local_598);
          (**(code **)(*plVar1 + 0x138))(plVar1,local_478);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_470);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
          ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                      *)&local_3f8,__rhs,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_598)
          ;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                    (local_538,&local_3f8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                   *)&local_3f8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
          ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                      *)&local_3f8,__rhs,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_598)
          ;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                    (local_530,&local_3f8);
          this_00 = local_540;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                   *)&local_3f8);
          std::__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_500,&local_598);
        }
      }
      else {
        std::make_shared<chrono::ChFunction_Setpoint>();
        std::make_shared<chrono::ChLinkMotorRotationAngle>();
        peVar2 = local_598._M_ptr;
        std::operator+(&local_520,&local_558->m_name,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_3f8,&local_520,__rhs);
        std::__cxx11::string::_M_assign((string *)(peVar2 + 8));
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_520);
        peVar2 = local_598._M_ptr;
        std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChBodyAuxRef,void>(local_498,&local_550);
        std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChBodyAuxRef,void>(local_4a8,&local_570);
        calcJointFrame((ChCoordsys<double> *)&local_3f8,&local_360,
                       (ChVector<double> *)(joints + local_588 + 0x98));
        ChFrame<double>::ChFrame(&local_b8,(ChCoordsys<double> *)&local_3f8);
        (**(code **)(*(long *)peVar2 + 0x240))(peVar2,local_498,local_4a8,&local_b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_490);
        peVar2 = local_598._M_ptr;
        std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChFunction_Setpoint,void>
                  (local_438,
                   (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_580);
        ChLinkMotorRotationAngle::SetAngleFunction
                  (peVar2,(shared_ptr<chrono::ChFunction> *)local_438);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_430);
        plVar1 = *(long **)(((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                            &local_560->_M_ptr)->_M_ptr + 0x38);
        std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChLinkMotorRotationAngle,void>(local_448,&local_598);
        (**(code **)(*plVar1 + 0x138))(plVar1,local_448);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_440);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)&local_3f8,__rhs,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_598);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_538,&local_3f8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                 *)&local_3f8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)&local_3f8,__rhs,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_598);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_530,&local_3f8);
        this_00 = local_540;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                 *)&local_3f8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_598._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_580._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4f8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_488._M_refcount);
    lVar7 = local_588 + 0xb0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_570._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_550._M_refcount);
  return;
}

Assistant:

void RS_Limb::Initialize(std::shared_ptr<ChBodyAuxRef> chassis,
                         const ChVector<>& xyz,
                         const ChVector<>& rpy,
                         CollisionFamily::Enum collision_family,
                         ActuationMode wheel_mode) {
    // Set absolute position of link0
    auto parent_body = chassis;                               // parent body
    auto child_body = m_links.find("link0")->second->m_body;  // child body
    ChFrame<> X_GP = parent_body->GetFrame_REF_to_abs();      // global -> parent
    ChFrame<> X_PC(xyz, rpy2quat(rpy));                       // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                             // global -> child
    child_body->SetFrame_REF_to_abs(X_GC);

    // Traverse chain (base-to-tip)
    //   set absolute position of the child body
    //   add collision shapes on child body
    //   create joint between parent and child
    for (int i = 0; i < num_joints; i++) {
        auto parent = m_links.find(joints[i].linkA)->second;       // parent part
        auto child = m_links.find(joints[i].linkB)->second;        // child part
        parent_body = parent->m_body;                              // parent body
        child_body = child->m_body;                                // child body
        X_GP = parent_body->GetFrame_REF_to_abs();                 // global -> parent
        X_PC = ChFrame<>(joints[i].xyz, rpy2quat(joints[i].rpy));  // parent -> child
        X_GC = X_GP * X_PC;                                        // global -> child
        child_body->SetFrame_REF_to_abs(X_GC);

        // First joint connects directly to chassis
        if (i == 0)
            parent_body = chassis;

        // Add contact geometry to child body
        child->AddCollisionShapes();

        // Place all links from this limb in the same collision family
        child_body->GetCollisionModel()->SetFamily(collision_family);
        child_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(collision_family);

        // Note: call this AFTER setting the collision family (required for Chrono::Multicore)
        if (child == m_wheel)
            child_body->SetCollide(m_collide_wheel);
        else
            child_body->SetCollide(m_collide_links);

        // Weld joints
        if (joints[i].fixed) {
            auto joint = chrono_types::make_shared<ChLinkLockLock>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, calcJointFrame(X_GC, joints[i].axis));
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            continue;
        }

        // Actuated joints (except the wheel motor joint)
        if (joints[i].name.compare("joint8") != 0) {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationAngle>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetAngleFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            continue;
        }

        // Wheel motor joint
        if (wheel_mode == ActuationMode::SPEED) {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetSpeedFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            m_wheel_motor = joint;
        } else {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationAngle>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetAngleFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            m_wheel_motor = joint;
        }
    }
}